

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::prepareChildren(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
                  *this,Node *n,bool backtrackable)

{
  ulong uVar1;
  VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *this_00;
  byte in_DL;
  long *in_RSI;
  long in_RDI;
  IntermediateNode *inode;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  Stack<unsigned_int> *in_stack_ffffffffffffff70;
  BacktrackData *this_01;
  anon_class_8_1_8991fb9c_for__fun_conflict function;
  UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  *in_stack_ffffffffffffff88;
  BacktrackData local_60;
  AbstractingUnifier *local_58;
  bool bStack_50;
  undefined7 uStack_4f;
  long *local_48;
  undefined1 local_11;
  long *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  uVar1 = (**(code **)(*in_RSI + 0x10))();
  if ((uVar1 & 1) == 0) {
    local_48 = local_10;
    Lib::Stack<unsigned_int>::push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    local_58 = (AbstractingUnifier *)0x0;
    bStack_50 = false;
    uStack_4f = 0;
    function.this =
         (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *)&stack0xffffffffffffffa8;
    Lib::Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_>::Option
              ((Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *)0x32b6e1);
    Lib::Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_>::operator=
              ((Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *)in_stack_ffffffffffffff70
               ,(Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *)
                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Lib::Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_>::~Option
              ((Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *)0x32b700);
    this_00 = (VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)
              (in_RDI + 0x48);
    this_01 = &local_60;
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::selectPotentiallyUnifiableChildren<Indexing::LiteralClause>
              (in_stack_ffffffffffffff88,(IntermediateNode *)function.this);
    Lib::Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>
    ::push((Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>
            *)function.this,
           (VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)this_01)
    ;
    Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>::
    ~VirtualIterator(this_00);
    if ((local_11 & 1) != 0) {
      Lib::Stack<Lib::BacktrackData>::top((Stack<Lib::BacktrackData> *)(in_RDI + 0x70));
      Lib::BacktrackData::
      addClosure<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::prepareChildren(Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*,bool)::_lambda()_1_>
                (this_01,function);
    }
  }
  else {
    (**(code **)(*local_10 + 0x40))();
    Lib::some<Lib::VirtualIterator<Indexing::LiteralClause*>>
              ((VirtualIterator<Indexing::LiteralClause_*> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Lib::Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_>::operator=
              ((Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *)in_stack_ffffffffffffff70
               ,(Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *)
                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Lib::Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_>::~Option
              ((Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *)0x32b661);
    Lib::VirtualIterator<Indexing::LiteralClause_*>::~VirtualIterator
              ((VirtualIterator<Indexing::LiteralClause_*> *)in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void prepareChildren(Node* n, bool backtrackable) {
        if(n->isLeaf()) {
          _leafData = some(static_cast<Leaf*>(n)->allChildren());
        } else {
          IntermediateNode* inode=static_cast<IntermediateNode*>(n);
          _svStack.push(inode->childVar);
          _leafData = {};
          DEBUG_QUERY(1, "entering node: S", _svStack.top())
          
          _nodeIterators.push(_algo.template selectPotentiallyUnifiableChildren<LeafData>(inode));
          if (backtrackable) {
            _bdStack.top().addClosure([&]() { 
                DEBUG_CODE(auto var = )_svStack.pop();
                DEBUG_QUERY(1, "backtracking node: S", var)
                _nodeIterators.pop(); 
            });
          }
        }
      }